

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_include(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  sxi32 sVar1;
  SyString sFile;
  SyString local_20;
  
  if ((0 < nArg) &&
     (local_20.zString = jx9_value_to_string(*apArg,(int *)&local_20.nByte), local_20.nByte != 0)) {
    sVar1 = VmExecIncludedFile(pCtx,&local_20,0);
    if (sVar1 == 0) {
      return 0;
    }
    jx9_context_throw_error_format(pCtx,2,"IO error while importing: \'%z\'",&local_20);
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    (pObj->x).rVal = 0.0;
    pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
    return 0;
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int vm_builtin_include(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyString sFile;
	sxi32 rc;
	if( nArg < 1 ){
		/* Nothing to evaluate, return NULL */
		jx9_result_null(pCtx);
		return SXRET_OK;
	}
	/* File to include */
	sFile.zString = jx9_value_to_string(apArg[0], (int *)&sFile.nByte);
	if( sFile.nByte < 1 ){
		/* Empty string, return NULL */
		jx9_result_null(pCtx);
		return SXRET_OK;
	}
	/* Open, compile and execute the desired script */
	rc = VmExecIncludedFile(&(*pCtx), &sFile, FALSE);
	if( rc != SXRET_OK ){
		/* Emit a warning and return false */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, "IO error while importing: '%z'", &sFile);
		jx9_result_bool(pCtx, 0);
	}
	return SXRET_OK;
}